

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_chunk.c
# Opt level: O0

nng_err chunk_ingest_char(nni_http_chunks *cl,char c)

{
  ushort **ppuVar1;
  nng_err local_18;
  nng_err rv;
  char c_local;
  nni_http_chunks *cl_local;
  
  switch(cl->cl_state) {
  case CS_INIT:
    ppuVar1 = __ctype_b_loc();
    if (((*ppuVar1)[(int)c] & 8) == 0) {
      return NNG_EPROTO;
    }
    cl->cl_state = CS_LEN;
  case CS_LEN:
    local_18 = chunk_ingest_len(cl,c);
    break;
  case CS_EXT:
    local_18 = chunk_ingest_ext(cl,c);
    break;
  case CS_CR:
    local_18 = chunk_ingest_newline(cl,c);
    break;
  default:
    local_18 = NNG_EPROTO;
    break;
  case CS_TRLR:
    local_18 = chunk_ingest_trailer(cl,c);
    break;
  case CS_TRLRCR:
    local_18 = chunk_ingest_trailercr(cl,c);
  }
  return local_18;
}

Assistant:

static nng_err
chunk_ingest_char(nni_http_chunks *cl, char c)
{
	nng_err rv;
	switch (cl->cl_state) {
	case CS_INIT:
		if (!isalnum(c)) {
			rv = NNG_EPROTO;
			break;
		}
		cl->cl_state = CS_LEN;
		// fallthrough
	case CS_LEN:
		rv = chunk_ingest_len(cl, c);
		break;
	case CS_EXT:
		rv = chunk_ingest_ext(cl, c);
		break;
	case CS_CR:
		rv = chunk_ingest_newline(cl, c);
		break;
	case CS_TRLR:
		rv = chunk_ingest_trailer(cl, c);
		break;
	case CS_TRLRCR:
		rv = chunk_ingest_trailercr(cl, c);
		break;
	default:
		// NB: No support for CS_DATA here, as that is handled
		// in the caller for reasons of efficiency.
		rv = NNG_EPROTO;
		break;
	}

	return (rv);
}